

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

string * __thiscall
PacketReader::GetFixedString_abi_cxx11_
          (string *__return_storage_ptr__,PacketReader *this,size_t length)

{
  allocator<char> local_11;
  
  if ((this->data)._M_string_length - this->pos < length) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
    this->pos = this->pos + __return_storage_ptr__->_M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PacketReader::GetFixedString(std::size_t length)
{
	if (this->Remaining() < length)
		return "";

	std::string ret = this->data.substr(this->pos, length);
	this->pos += ret.length();

	return ret;
}